

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O0

void __thiscall CP::queue<int>::back_to_front(queue<int> *this)

{
  int *piVar1;
  int iVar2;
  size_t local_38;
  int local_1c;
  int local_18 [2];
  queue<int> *pqStack_10;
  int tmp;
  queue<int> *this_local;
  
  pqStack_10 = this;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  if (this->mSize != 0) {
    piVar1 = this->mData;
    local_18[0] = (int)this->mFront + (int)this->mSize + -1;
    local_1c = (int)this->mCap;
    iVar2 = fast_mod(local_18,&local_1c);
    iVar2 = piVar1[iVar2];
    if (this->mFront == 0) {
      local_38 = this->mCap;
    }
    else {
      local_38 = this->mFront;
    }
    local_38 = local_38 - 1;
    this->mFront = local_38;
    this->mData[this->mFront] = iVar2;
  }
  return;
}

Assistant:

void CP::queue<T>::back_to_front() {
    std::ios::sync_with_stdio(0);
    std::cin.tie(0);
    if (mSize == 0)
        return;
    T tmp = mData[fast_mod(mFront + mSize - 1, mCap)];
    mFront = mFront == 0 ? mCap - 1 : mFront - 1;
    mData[mFront] = tmp;
}